

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O3

int wasm_eval(uint8_t *digitPtr)

{
  void *__dest;
  int iVar1;
  ggml_opt_dataset_t dataset;
  long lVar2;
  size_t __n;
  undefined8 uVar3;
  ggml_opt_result_t pgVar4;
  int32_t pred;
  vector<float,_std::allocator<float>_> digit;
  mnist_model model;
  string local_140;
  string local_120;
  void *local_100 [2];
  long local_f0;
  mnist_model local_e8;
  
  std::vector<float,std::allocator<float>>::vector<unsigned_char*,void>
            ((vector<float,std::allocator<float>> *)local_100,digitPtr,digitPtr + 0x310,
             (allocator_type *)&local_e8);
  dataset = (ggml_opt_dataset_t)ggml_opt_dataset_init(0x310,10,1,1);
  lVar2 = ggml_opt_dataset_data(dataset);
  __dest = *(void **)(lVar2 + 0xf8);
  __n = ggml_nbytes(lVar2);
  memcpy(__dest,digitPtr,__n);
  uVar3 = ggml_opt_dataset_labels(dataset);
  ggml_set_zero(uVar3);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mnist-f32.gguf","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"CPU","");
  mnist_model_init_from_file(&local_e8,&local_140,&local_120,1,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  mnist_model_build(&local_e8);
  pgVar4 = mnist_model_eval(&local_e8,dataset);
  ggml_opt_result_pred(pgVar4,&local_140);
  iVar1 = (int)local_140._M_dataplus._M_p;
  mnist_model::~mnist_model(&local_e8);
  if (local_100[0] != (void *)0x0) {
    operator_delete(local_100[0],local_f0 - (long)local_100[0]);
  }
  return iVar1;
}

Assistant:

int wasm_eval(uint8_t * digitPtr) {
    std::vector<float> digit(digitPtr, digitPtr + MNIST_NINPUT);

    ggml_opt_dataset_t dataset = ggml_opt_dataset_init(MNIST_NINPUT, MNIST_NCLASSES, 1, 1);
    struct ggml_tensor * data = ggml_opt_dataset_data(dataset);
    memcpy(data->data, digitPtr, ggml_nbytes(data));
    ggml_set_zero(ggml_opt_dataset_labels(dataset)); // The labels are not needed.

    mnist_model model = mnist_model_init_from_file("mnist-f32.gguf", "CPU", /*nbatch_logical =*/ 1, /*nbatch_physical =*/ 1);
    mnist_model_build(model);
    ggml_opt_result_t result = mnist_model_eval(model, dataset);

    int32_t pred;
    ggml_opt_result_pred(result, &pred);

    return pred;
}